

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMCatalogue.cpp
# Opt level: O0

Request * __thiscall
ROM::Request::append(Request *__return_storage_ptr__,Request *this,Type type,Request *rhs)

{
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *this_00;
  __normal_iterator<ROM::Request::Node_*,_std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>_>
  local_40;
  const_iterator local_38;
  undefined1 local_29;
  Node *local_28;
  Request *rhs_local;
  Request *pRStack_18;
  Type type_local;
  Request *this_local;
  Request *parent;
  
  local_28 = &rhs->node;
  rhs_local._4_4_ = type;
  pRStack_18 = this;
  this_local = __return_storage_ptr__;
  bVar1 = Node::empty(&this->node);
  if ((!bVar1) || (bVar1 = Node::empty(local_28), bVar1)) {
    bVar1 = Node::empty(local_28);
    if (bVar1) {
      Request(__return_storage_ptr__,this);
    }
    else if (((this->node).type == rhs_local._4_4_) && (local_28->type == rhs_local._4_4_)) {
      local_29 = 0;
      Request(__return_storage_ptr__,this);
      this_00 = &(__return_storage_ptr__->node).children;
      local_40._M_current =
           (Node *)std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::end
                             (this_00);
      __gnu_cxx::
      __normal_iterator<ROM::Request::Node_const*,std::vector<ROM::Request::Node,std::allocator<ROM::Request::Node>>>
      ::__normal_iterator<ROM::Request::Node*>
                ((__normal_iterator<ROM::Request::Node_const*,std::vector<ROM::Request::Node,std::allocator<ROM::Request::Node>>>
                  *)&local_38,&local_40);
      __first = std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::begin
                          (&local_28->children);
      __last = std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::end
                         (&local_28->children);
      std::vector<ROM::Request::Node,std::allocator<ROM::Request::Node>>::
      insert<__gnu_cxx::__normal_iterator<ROM::Request::Node_const*,std::vector<ROM::Request::Node,std::allocator<ROM::Request::Node>>>,void>
                ((vector<ROM::Request::Node,std::allocator<ROM::Request::Node>> *)this_00,local_38,
                 (__normal_iterator<const_ROM::Request::Node_*,_std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>_>
                  )__first._M_current,
                 (__normal_iterator<const_ROM::Request::Node_*,_std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>_>
                  )__last._M_current);
      Node::sort(&__return_storage_ptr__->node);
    }
    else if (((this->node).type == rhs_local._4_4_) && (local_28->type == One)) {
      Request(__return_storage_ptr__,this);
      std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::push_back
                (&(__return_storage_ptr__->node).children,local_28);
      Node::sort(&__return_storage_ptr__->node);
    }
    else if ((local_28->type == rhs_local._4_4_) && ((this->node).type == One)) {
      Request(__return_storage_ptr__,(Request *)local_28);
      std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::push_back
                (&(__return_storage_ptr__->node).children,&this->node);
      Node::sort(&__return_storage_ptr__->node);
    }
    else {
      Request(__return_storage_ptr__);
      (__return_storage_ptr__->node).type = rhs_local._4_4_;
      std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::push_back
                (&(__return_storage_ptr__->node).children,&this->node);
      std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::push_back
                (&(__return_storage_ptr__->node).children,local_28);
    }
  }
  else {
    Request(__return_storage_ptr__,(Request *)local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

Request Request::append(Node::Type type, const Request &rhs) {
	// If either side is empty, act appropriately.
	if(node.empty() && !rhs.node.empty()) {
		return rhs;
	}
	if(rhs.node.empty()) {
		return *this;
	}

	// Just copy in the RHS child nodes if types match.
	if(node.type == type && rhs.node.type == type) {
		Request new_request = *this;
		new_request.node.children.insert(new_request.node.children.end(), rhs.node.children.begin(), rhs.node.children.end());
		new_request.node.sort();
		return new_request;
	}

	// Possibly: left is appropriate request and rhs is just one more thing?
	if(node.type == type && rhs.node.type == Node::Type::One) {
		Request new_request = *this;
		new_request.node.children.push_back(rhs.node);
		new_request.node.sort();
		return new_request;
	}

	// Or: right is appropriate request and this is just one more thing?
	if(rhs.node.type == type && node.type == Node::Type::One) {
		Request new_request = rhs;
		new_request.node.children.push_back(node);
		new_request.node.sort();
		return new_request;
	}

	// Otherwise create a new parent node.
	Request parent;
	parent.node.type = type;
	parent.node.children.push_back(this->node);
	parent.node.children.push_back(rhs.node);
	return parent;
}